

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O1

bool __thiscall duckdb::BaseStatistics::IsConstant(BaseStatistics *this)

{
  StatisticsType SVar1;
  bool bVar2;
  
  if ((this->type).id_ == VALIDITY) {
    if (this->has_null == true) {
      if (this->has_no_null != true) {
        return true;
      }
    }
    else if (this->has_no_null != false) {
      return true;
    }
  }
  else {
    SVar1 = GetStatsType(&this->type);
    if (SVar1 == NUMERIC_STATS) {
      bVar2 = NumericStats::IsConstant(this);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool BaseStatistics::IsConstant() const {
	if (type.id() == LogicalTypeId::VALIDITY) {
		// validity mask
		if (CanHaveNull() && !CanHaveNoNull()) {
			return true;
		}
		if (!CanHaveNull() && CanHaveNoNull()) {
			return true;
		}
		return false;
	}
	switch (GetStatsType()) {
	case StatisticsType::NUMERIC_STATS:
		return NumericStats::IsConstant(*this);
	default:
		break;
	}
	return false;
}